

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# book.hpp
# Opt level: O0

void __thiscall
Excel::Book::onCell(Book *this,size_t sheetIdx,size_t row,size_t column,wstring *value)

{
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *in_RCX;
  wstring *in_R8;
  size_t in_stack_00000168;
  Book *in_stack_00000170;
  wstring *this_00;
  size_t in_stack_ffffffffffffffa8;
  Sheet *in_stack_ffffffffffffffb0;
  wstring local_48 [32];
  wstring *local_28;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *local_20;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  sheet(in_stack_00000170,in_stack_00000168);
  this_00 = local_48;
  std::__cxx11::wstring::wstring(this_00,local_28);
  Sheet::setCell<std::__cxx11::wstring>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(size_t)this_00,local_20);
  std::__cxx11::wstring::~wstring(local_48);
  return;
}

Assistant:

inline void
Book::onCell( size_t sheetIdx, size_t row, size_t column, const std::wstring & value )
{
	sheet( sheetIdx )->setCell( row, column, value );
}